

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

void __thiscall QLibrary::setFileNameAndVersion(QLibrary *this,QString *fileName,QString *version)

{
  bool bVar1;
  QLibraryPrivate *pointer;
  undefined8 in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLibraryPrivate *dd;
  LoadHints lh;
  QLibraryPrivate *in_stack_ffffffffffffffc0;
  QFlagsStorage<QLibrary::LoadHint> loadHints;
  QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> local_20;
  Int local_14;
  QFlagsStorageHelper<QLibrary::LoadHint,_4> local_10;
  Int local_c;
  long local_8;
  
  loadHints.i = (Int)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0xaaaaaaaa;
  QFlags<QLibrary::LoadHint>::QFlags((QFlags<QLibrary::LoadHint> *)0x8c5432);
  bVar1 = QTaggedPointer::operator_cast_to_bool
                    ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c543f);
  if (bVar1) {
    QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::operator->
              ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c5452);
    local_10.super_QFlagsStorage<QLibrary::LoadHint>.i =
         (QFlagsStorage<QLibrary::LoadHint>)QLibraryPrivate::loadHints(in_stack_ffffffffffffffc0);
    local_c = (Int)local_10.super_QFlagsStorage<QLibrary::LoadHint>.i;
    QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::operator->
              ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c5473);
    QLibraryPrivate::release((QLibraryPrivate *)0x8c547b);
  }
  local_14 = local_c;
  pointer = QLibraryPrivate::findOrCreate
                      (&in_stack_ffffffffffffffc0->fileName,in_RDI,(LoadHints)loadHints.i);
  QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::QTaggedPointer
            (&local_20,pointer,NotLoaded);
  (in_RDI->d).size = local_20.d;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLibrary::setFileNameAndVersion(const QString &fileName, const QString &version)
{
    QLibrary::LoadHints lh;
    if (d) {
        lh = d->loadHints();
        d->release();
    }
    QLibraryPrivate *dd = QLibraryPrivate::findOrCreate(fileName, version, lh);
    d = QTaggedPointer(dd, NotLoaded);      // we haven't load()ed
}